

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_6aa98::DepsLogTestLotsOfDeps::Run(DepsLogTestLotsOfDeps *this)

{
  Test *pTVar1;
  bool bVar2;
  LoadStatus LVar3;
  size_t sVar4;
  Node *pNVar5;
  Deps *pDVar6;
  int i;
  uint uVar7;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  allocator<char> local_349;
  string err;
  string local_328;
  DepsLog log2;
  DepsLog log1;
  State state2;
  State state1;
  
  State::State(&state1);
  pTVar1 = g_current_test;
  log1.file_path_._M_dataplus._M_p = (pointer)&log1.file_path_.field_2;
  log1.needs_recompaction_ = false;
  log1.file_ = (FILE *)0x0;
  log1.file_path_._M_string_length = 0;
  log1.file_path_.field_2._M_local_buf[0] = '\0';
  log1.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  log1.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  log1.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  log1.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  log1.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  log1.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state2,"DepsLogTest-tempfile",(allocator<char> *)&log2);
  bVar2 = DepsLog::OpenForWrite(&log1,(string *)&state2,&err);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
             ,0x62,"log1.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&state2);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",&err);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,99,"\"\" == err");
  if (!bVar2) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00152dd1;
  }
  log2.needs_recompaction_ = false;
  log2._1_7_ = 0;
  log2.file_ = (FILE *)0x0;
  log2.file_path_._M_dataplus._M_p = (pointer)0x0;
  for (uVar7 = 0; uVar7 != 100000; uVar7 = uVar7 + 1) {
    sprintf((char *)&state2,"file%d.h",(ulong)uVar7);
    sVar4 = strlen((char *)&state2);
    path.len_ = sVar4;
    path.str_ = (char *)&state2;
    local_328._M_dataplus._M_p = (pointer)State::GetNode(&state1,path,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&log2,(Node **)&local_328);
  }
  path_00.len_ = 5;
  path_00.str_ = "out.o";
  pNVar5 = State::GetNode(&state1,path_00,0);
  DepsLog::RecordDeps(&log1,pNVar5,1,(vector<Node_*,_std::allocator<Node_*>_> *)&log2);
  path_01.len_ = 5;
  path_01.str_ = "out.o";
  pNVar5 = State::GetNode(&state1,path_01,0);
  pDVar6 = DepsLog::GetDeps(&log1,pNVar5);
  bVar2 = testing::Test::Check
                    (g_current_test,pDVar6->node_count == 100000,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x6f,"kNumDeps == log_deps->node_count");
  if (!bVar2) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
              ((_Vector_base<Node_*,_std::allocator<Node_*>_> *)&log2);
    goto LAB_00152dd1;
  }
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            ((_Vector_base<Node_*,_std::allocator<Node_*>_> *)&log2);
  DepsLog::Close(&log1);
  State::State(&state2);
  pTVar1 = g_current_test;
  log2.file_path_._M_dataplus._M_p = (pointer)&log2.file_path_.field_2;
  log2._0_8_ = log2._0_8_ & 0xffffffffffffff00;
  log2.file_ = (FILE *)0x0;
  log2.file_path_._M_string_length = 0;
  log2.file_path_.field_2._M_local_buf[0] = '\0';
  log2.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  log2.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  log2.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  log2.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  log2.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  log2.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"DepsLogTest-tempfile",&local_349);
  LVar3 = DepsLog::Load(&log2,&local_328,&state2,&err);
  testing::Test::Check
            (pTVar1,LVar3 != LOAD_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
             ,0x76,"log2.Load(kTestFilename, &state2, &err)");
  std::__cxx11::string::~string((string *)&local_328);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",&err);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x77,"\"\" == err");
  if (bVar2) {
    path_02.len_ = 5;
    path_02.str_ = "out.o";
    pNVar5 = State::GetNode(&state2,path_02,0);
    pDVar6 = DepsLog::GetDeps(&log2,pNVar5);
    bVar2 = testing::Test::Check
                      (g_current_test,pDVar6->node_count == 100000,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x7a,"kNumDeps == log_deps->node_count");
    if (!bVar2) goto LAB_00152da2;
  }
  else {
LAB_00152da2:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  DepsLog::~DepsLog(&log2);
  State::~State(&state2);
LAB_00152dd1:
  std::__cxx11::string::~string((string *)&err);
  DepsLog::~DepsLog(&log1);
  State::~State(&state1);
  return;
}

Assistant:

TEST_F(DepsLogTest, LotsOfDeps) {
  const int kNumDeps = 100000;  // More than 64k.

  State state1;
  DepsLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, &err));
  ASSERT_EQ("", err);

  {
    vector<Node*> deps;
    for (int i = 0; i < kNumDeps; ++i) {
      char buf[32];
      sprintf(buf, "file%d.h", i);
      deps.push_back(state1.GetNode(buf, 0));
    }
    log1.RecordDeps(state1.GetNode("out.o", 0), 1, deps);

    DepsLog::Deps* log_deps = log1.GetDeps(state1.GetNode("out.o", 0));
    ASSERT_EQ(kNumDeps, log_deps->node_count);
  }

  log1.Close();

  State state2;
  DepsLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &state2, &err));
  ASSERT_EQ("", err);

  DepsLog::Deps* log_deps = log2.GetDeps(state2.GetNode("out.o", 0));
  ASSERT_EQ(kNumDeps, log_deps->node_count);
}